

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O3

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::GetCallbackInlinee
          (FunctionCodeGenRuntimeData *this,ProfileId profiledCallSiteId)

{
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar1;
  FunctionCodeGenRuntimeData *pFVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  FunctionCodeGenRuntimeData *local_28;
  
  if (((this->functionBody).ptr)->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xbe,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pWVar1 = (this->callbackInlinees).ptr;
  if (pWVar1 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    local_28 = (FunctionCodeGenRuntimeData *)0x0;
  }
  else {
    pFVar2 = pWVar1[profiledCallSiteId].ptr;
    Memory::Recycler::WBSetBit((char *)&local_28);
    local_28 = pFVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_28);
  }
  return local_28;
}

Assistant:

const FunctionCodeGenRuntimeData *FunctionCodeGenRuntimeData::GetCallbackInlinee(const ProfileId profiledCallSiteId) const
    {
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());

        return callbackInlinees ? callbackInlinees[profiledCallSiteId] : nullptr;
    }